

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  size_t *psVar8;
  byte *in_RSI;
  Mat *in_RDI;
  Option *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  Mat *in_stack_00000010;
  Mat *in_stack_00000018;
  float scale_in;
  int p;
  int out_elempack;
  int elempack;
  int num_input;
  int maxk;
  int in_stack_00000090;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  Mat *in_stack_000000a0;
  Mat *in_stack_000000a8;
  int in_stack_00000100;
  int in_stack_00000104;
  int in_stack_00000108;
  int in_stack_0000010c;
  Mat *in_stack_00000110;
  Mat *in_stack_00000118;
  int in_stack_00000188;
  int in_stack_0000018c;
  int in_stack_00000190;
  int in_stack_00000194;
  Mat *in_stack_00000198;
  Mat *in_stack_000001a0;
  int in_stack_00000250;
  int in_stack_00000258;
  int in_stack_00000288;
  int in_stack_0000028c;
  int in_stack_00000290;
  int in_stack_00000294;
  Mat *in_stack_00000298;
  Mat *in_stack_000002a0;
  Option *in_stack_00000308;
  int in_stack_00000310;
  int in_stack_00000314;
  Mat *in_stack_00000318;
  Mat *in_stack_00000320;
  Option *in_stack_000003a8;
  int in_stack_000003b0;
  int in_stack_000003b4;
  Mat *in_stack_000003b8;
  Mat *in_stack_000003c0;
  Allocator *in_stack_ffffffffffffff28;
  undefined8 *puVar9;
  size_t *in_stack_ffffffffffffff30;
  size_t *in_stack_ffffffffffffff38;
  int _w;
  size_t *psVar10;
  Mat *pMVar11;
  float local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  
  uVar6 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) /
          (long)(*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
                *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)));
  iVar7 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
               (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
  local_ac = 1;
  local_b0 = 1;
  if ((in_RSI[0x27] & 1) != 0) {
    local_ac = 1;
    if (iVar7 % 8 == 0) {
      local_ac = 8;
    }
    local_b0 = 1;
    if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
      local_b0 = 4;
    }
  }
  if ((local_ac == 8) && (local_b0 == 4)) {
    if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
       ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)) &&
        ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
         (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            ((((((in_RSI[0x38] & 1) == 0 ||
                (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3))
               || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)) ||
              ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
               (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1))))
             || ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                  1 || (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        != 1)))))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        convolution_transform_kernel_packed_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
      }
      else {
        convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090);
      }
    }
    else {
      conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
                (in_stack_00000320,in_stack_00000318,in_stack_00000314,in_stack_00000310,
                 in_stack_00000308);
    }
  }
  if ((local_ac == 1) && (local_b0 == 4)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) &&
            ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3 &&
               (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))
              && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1))
             && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                  1 && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 1)))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) &&
             ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))))
            && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                  2 && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 7) &&
             (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 7 &&
               (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))
              && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) && ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                     == 2 && (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))) {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
    else if ((in_RSI[0x1d] & 1) == 0) {
      convolution_transform_kernel_packed_int8_sse
                (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                 in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
    }
    else {
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                (in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000108,
                 in_stack_00000104,in_stack_00000100);
    }
  }
  if ((local_ac == 8) && (local_b0 == 1)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000188);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000188);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            (((((((in_RSI[0x38] & 1) == 0 ||
                 (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3)
                 ) || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)
                ) || ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4)
                       != 1 || (*(int *)((long)&in_RDI[3].refcount +
                                        *(long *)((long)in_RDI->data + -0x18)) != 1)))) ||
              (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) != 1)
              ) || (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1
                   )))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        convolution_transform_kernel_packed_int8_sse
                  (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                   in_stack_00000094,in_stack_00000090,in_stack_00000250,in_stack_00000258);
      }
      else {
        convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                  (in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000190,
                   in_stack_0000018c,in_stack_00000188);
      }
    }
    else {
      conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
                (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,
                 in_stack_000003a8);
    }
  }
  _w = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((local_ac == 1) && (local_b0 == 1)) {
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
          (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1)))) &&
       ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
        (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
      convolution_im2col_sgemm_transform_kernel_int8_sse
                (in_stack_000002a0,in_stack_00000298,in_stack_00000294,in_stack_00000290,
                 in_stack_0000028c,in_stack_00000288);
    }
    else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) &&
            (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
              ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2
               && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 2)
               ))))))) {
      convolution_im2col_sgemm_transform_kernel_int8_sse
                (in_stack_000002a0,in_stack_00000298,in_stack_00000294,in_stack_00000290,
                 in_stack_0000028c,in_stack_00000288);
    }
    else if (((in_RSI[0x1c] & 1) == 0) ||
            ((((((in_RSI[0x37] & 1) == 0 ||
                (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3))
               || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)) ||
              (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
                (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1))
               || ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                    != 1 || ((*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) != 1 || (iVar7 < 0x10))
                            )))))) ||
             (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10)))) {
      if ((in_RSI[0x1d] & 1) == 0) {
        lVar3 = *(long *)((long)in_RDI->data + -0x18);
        psVar8 = (size_t *)((long)&in_RDI[4].cstep + lVar3);
        in_stack_ffffffffffffff38 = &in_RDI->elemsize;
        if (in_stack_ffffffffffffff38 != psVar8) {
          if (*(long *)((long)&in_RDI[5].data + lVar3) != 0) {
            piVar4 = *(int **)((long)&in_RDI[5].data + lVar3);
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          psVar10 = in_stack_ffffffffffffff38;
          pMVar11 = in_RDI;
          if (*(long *)&in_RDI->elempack != 0) {
            piVar4 = *(int **)&in_RDI->elempack;
            LOCK();
            iVar7 = *piVar4;
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (iVar7 == 1) {
              lVar2._0_4_ = in_RDI->h;
              lVar2._4_4_ = in_RDI->d;
              if (lVar2 == 0) {
                if ((void *)*in_stack_ffffffffffffff38 != (void *)0x0) {
                  free((void *)*in_stack_ffffffffffffff38);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI->h + 0x18))
                          (*(long **)&in_RDI->h,*in_stack_ffffffffffffff38);
              }
            }
          }
          *in_stack_ffffffffffffff38 = 0;
          in_stack_ffffffffffffff38[2] = 0;
          *(int *)(in_stack_ffffffffffffff38 + 3) = 0;
          *(int *)(in_stack_ffffffffffffff38 + 5) = 0;
          *(undefined4 *)((long)in_stack_ffffffffffffff38 + 0x2c) = 0;
          *(undefined4 *)(in_stack_ffffffffffffff38 + 6) = 0;
          *(undefined4 *)((long)in_stack_ffffffffffffff38 + 0x34) = 0;
          *(undefined4 *)(in_stack_ffffffffffffff38 + 7) = 0;
          in_stack_ffffffffffffff38[8] = 0;
          in_stack_ffffffffffffff38[1] = 0;
          *psVar10 = *psVar8;
          psVar10[1] = *(undefined8 *)((long)&in_RDI[5].data + lVar3);
          psVar10[2] = (size_t)*(Allocator **)((long)&in_RDI[5].refcount + lVar3);
          *(int *)(psVar10 + 3) = *(int *)((long)&in_RDI[5].elemsize + lVar3);
          psVar10[4] = *(undefined8 *)((long)&in_RDI[5].elempack + lVar3);
          *(int *)(psVar10 + 5) = *(int *)((long)&in_RDI[5].allocator + lVar3);
          *(undefined4 *)((long)psVar10 + 0x2c) =
               *(undefined4 *)((long)&in_RDI[5].allocator + lVar3 + 4);
          *(undefined4 *)(psVar10 + 6) = *(undefined4 *)((long)&in_RDI[5].dims + lVar3);
          *(undefined4 *)((long)psVar10 + 0x34) = *(undefined4 *)((long)&in_RDI[5].w + lVar3);
          *(undefined4 *)(psVar10 + 7) = *(undefined4 *)((long)&in_RDI[5].h + lVar3);
          psVar10[8] = *(undefined8 *)((long)&in_RDI[5].c + lVar3);
          in_stack_ffffffffffffff30 = in_stack_ffffffffffffff38;
          in_stack_ffffffffffffff38 = psVar10;
          in_RDI = pMVar11;
        }
      }
      else {
        convolution_im2col_sgemm_transform_kernel_int8_sse
                  (in_stack_000002a0,in_stack_00000298,in_stack_00000294,in_stack_00000290,
                   in_stack_0000028c,in_stack_00000288);
      }
      _w = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    }
    else {
      conv3x3s1_winograd23_transform_kernel_int8_sse
                (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                 unaff_retaddr);
    }
  }
  Mat::create(in_RDI,_w,(size_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (local_b4 = 0;
      local_b4 < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
      local_b4 = local_b4 + 1) {
    fVar1 = *(float *)(*(long *)((long)&in_RDI[6].cstep + *(long *)((long)in_RDI->data + -0x18)) +
                      (long)local_b4 * 4);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      local_b8 = 1.0 / (**(float **)((long)&in_RDI[7].cstep + *(long *)((long)in_RDI->data + -0x18))
                       * *(float *)(*(long *)((long)&in_RDI[6].cstep +
                                             *(long *)((long)in_RDI->data + -0x18)) +
                                   (long)local_b4 * 4));
    }
    else {
      local_b8 = 0.0;
    }
    *(float *)(*(long *)&in_RDI[5].elempack + (long)local_b4 * 4) = local_b8;
  }
  if ((*in_RSI & 1) != 0) {
    lVar3 = *(long *)((long)in_RDI->data + -0x18);
    puVar9 = (undefined8 *)((long)&in_RDI[4].cstep + lVar3);
    if (*(long *)((long)&in_RDI[5].data + lVar3) != 0) {
      piVar4 = *(int **)((long)&in_RDI[5].data + lVar3);
      LOCK();
      iVar7 = *piVar4;
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (iVar7 == 1) {
        if (*(long *)((long)&in_RDI[5].elempack + lVar3) == 0) {
          if ((void *)*puVar9 != (void *)0x0) {
            free((void *)*puVar9);
          }
        }
        else {
          plVar5 = *(long **)((long)&in_RDI[5].elempack + lVar3);
          (**(code **)(*plVar5 + 0x18))(plVar5,*puVar9);
        }
      }
    }
    *puVar9 = 0;
    puVar9[2] = 0;
    *(undefined4 *)(puVar9 + 3) = 0;
    *(undefined4 *)(puVar9 + 5) = 0;
    *(undefined4 *)((long)puVar9 + 0x2c) = 0;
    *(undefined4 *)(puVar9 + 6) = 0;
    *(undefined4 *)((long)puVar9 + 0x34) = 0;
    *(undefined4 *)(puVar9 + 7) = 0;
    puVar9[8] = 0;
    puVar9[1] = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}